

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void initial_setup(j_compress_ptr cinfo,boolean transcode_only)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int in_ESI;
  long *in_RDI;
  bool bVar5;
  JDIMENSION jd_samplesperrow;
  long samplesperrow;
  jpeg_component_info *compptr;
  int ssize;
  int ci;
  undefined4 local_44;
  undefined4 local_40;
  int local_3c;
  long local_20;
  int local_14;
  int local_10;
  
  if (in_ESI == 0) {
    jpeg_calc_jpeg_dimensions((j_compress_ptr)0x289bfa);
  }
  else {
    jpeg_calc_trans_dimensions((j_compress_ptr)0x289bee);
  }
  if ((*(int *)((long)in_RDI + 0x1dc) < 1) || (0x10 < *(int *)((long)in_RDI + 0x1dc))) {
    *(undefined4 *)(*in_RDI + 0x28) = 7;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x1dc);
    *(undefined4 *)(*in_RDI + 0x30) = *(undefined4 *)((long)in_RDI + 0x1dc);
    (**(code **)*in_RDI)(in_RDI);
  }
  switch(*(undefined4 *)((long)in_RDI + 0x1dc)) {
  case 2:
    in_RDI[0x3c] = (long)jpeg_natural_order2;
    break;
  case 3:
    in_RDI[0x3c] = (long)jpeg_natural_order3;
    break;
  case 4:
    in_RDI[0x3c] = (long)jpeg_natural_order4;
    break;
  case 5:
    in_RDI[0x3c] = (long)jpeg_natural_order5;
    break;
  case 6:
    in_RDI[0x3c] = (long)jpeg_natural_order6;
    break;
  case 7:
    in_RDI[0x3c] = (long)jpeg_natural_order7;
    break;
  default:
    in_RDI[0x3c] = (long)jpeg_natural_order;
  }
  if (*(int *)((long)in_RDI + 0x1dc) < 8) {
    local_3c = *(int *)((long)in_RDI + 0x1dc) * *(int *)((long)in_RDI + 0x1dc) + -1;
  }
  else {
    local_3c = 0x3f;
  }
  *(int *)(in_RDI + 0x3d) = local_3c;
  if ((((*(int *)((long)in_RDI + 0x54) == 0) || ((int)in_RDI[10] == 0)) ||
      (*(int *)((long)in_RDI + 0x5c) < 1)) || ((int)in_RDI[7] < 1)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x21;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((0xffdc < *(uint *)((long)in_RDI + 0x54)) || (0xffdc < *(uint *)(in_RDI + 10))) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2a;
    *(undefined4 *)(*in_RDI + 0x2c) = 0xffdc;
    (**(code **)*in_RDI)(in_RDI);
  }
  uVar1 = (ulong)*(uint *)(in_RDI + 6) * (long)(int)in_RDI[7];
  if ((uVar1 & 0xffffffff) != uVar1) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x48;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((int)in_RDI[0xb] != 8) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x10;
    *(int *)(*in_RDI + 0x2c) = (int)in_RDI[0xb];
    (**(code **)*in_RDI)(in_RDI);
  }
  if (10 < *(int *)((long)in_RDI + 0x5c)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x5c);
    *(undefined4 *)(*in_RDI + 0x30) = 10;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined4 *)((long)in_RDI + 0x15c) = 1;
  *(undefined4 *)(in_RDI + 0x2c) = 1;
  local_10 = 0;
  local_20 = in_RDI[0xd];
  for (; local_10 < *(int *)((long)in_RDI + 0x5c); local_10 = local_10 + 1) {
    if (((*(int *)(local_20 + 8) < 1) || (4 < *(int *)(local_20 + 8))) ||
       ((*(int *)(local_20 + 0xc) < 1 || (4 < *(int *)(local_20 + 0xc))))) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x13;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)(local_20 + 8) < *(int *)((long)in_RDI + 0x15c)) {
      local_40 = *(undefined4 *)((long)in_RDI + 0x15c);
    }
    else {
      local_40 = *(undefined4 *)(local_20 + 8);
    }
    *(undefined4 *)((long)in_RDI + 0x15c) = local_40;
    if (*(int *)(local_20 + 0xc) < (int)in_RDI[0x2c]) {
      local_44 = (undefined4)in_RDI[0x2c];
    }
    else {
      local_44 = *(undefined4 *)(local_20 + 0xc);
    }
    *(undefined4 *)(in_RDI + 0x2c) = local_44;
    local_20 = local_20 + 0x60;
  }
  local_10 = 0;
  local_20 = in_RDI[0xd];
  for (; local_10 < *(int *)((long)in_RDI + 0x5c); local_10 = local_10 + 1) {
    *(int *)(local_20 + 4) = local_10;
    local_14 = 1;
    while( true ) {
      iVar4 = 4;
      if ((int)in_RDI[0x26] != 0) {
        iVar4 = 8;
      }
      bVar5 = false;
      if (*(int *)((long)in_RDI + 0x164) * local_14 <= iVar4) {
        bVar5 = *(int *)((long)in_RDI + 0x15c) % (*(int *)(local_20 + 8) * local_14 * 2) == 0;
      }
      if (!bVar5) break;
      local_14 = local_14 << 1;
    }
    *(int *)(local_20 + 0x24) = *(int *)((long)in_RDI + 0x164) * local_14;
    local_14 = 1;
    while( true ) {
      iVar4 = 4;
      if ((int)in_RDI[0x26] != 0) {
        iVar4 = 8;
      }
      bVar5 = false;
      if ((int)in_RDI[0x2d] * local_14 <= iVar4) {
        bVar5 = (int)in_RDI[0x2c] % (*(int *)(local_20 + 0xc) * local_14 * 2) == 0;
      }
      if (!bVar5) break;
      local_14 = local_14 << 1;
    }
    *(int *)(local_20 + 0x28) = (int)in_RDI[0x2d] * local_14;
    iVar4 = *(int *)(local_20 + 0x24);
    iVar3 = *(int *)(local_20 + 0x28) * 2;
    if (iVar4 == iVar3 || SBORROW4(iVar4,iVar3) != iVar4 + *(int *)(local_20 + 0x28) * -2 < 0) {
      iVar4 = *(int *)(local_20 + 0x28);
      iVar3 = *(int *)(local_20 + 0x24) * 2;
      if (iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == iVar4 + *(int *)(local_20 + 0x24) * -2 < 0) {
        *(int *)(local_20 + 0x28) = *(int *)(local_20 + 0x24) << 1;
      }
    }
    else {
      *(int *)(local_20 + 0x24) = *(int *)(local_20 + 0x28) << 1;
    }
    lVar2 = jdiv_round_up((ulong)*(uint *)(in_RDI + 10) * (long)*(int *)(local_20 + 8),
                          (long)(*(int *)((long)in_RDI + 0x15c) * *(int *)((long)in_RDI + 0x1dc)));
    *(int *)(local_20 + 0x1c) = (int)lVar2;
    lVar2 = jdiv_round_up((ulong)*(uint *)((long)in_RDI + 0x54) * (long)*(int *)(local_20 + 0xc),
                          (long)((int)in_RDI[0x2c] * *(int *)((long)in_RDI + 0x1dc)));
    *(int *)(local_20 + 0x20) = (int)lVar2;
    lVar2 = jdiv_round_up((ulong)*(uint *)(in_RDI + 10) *
                          (long)(*(int *)(local_20 + 8) * *(int *)(local_20 + 0x24)),
                          (long)(*(int *)((long)in_RDI + 0x15c) * *(int *)((long)in_RDI + 0x1dc)));
    *(int *)(local_20 + 0x2c) = (int)lVar2;
    lVar2 = jdiv_round_up((ulong)*(uint *)((long)in_RDI + 0x54) *
                          (long)(*(int *)(local_20 + 0xc) * *(int *)(local_20 + 0x28)),
                          (long)((int)in_RDI[0x2c] * *(int *)((long)in_RDI + 0x1dc)));
    *(int *)(local_20 + 0x30) = (int)lVar2;
    *(undefined4 *)(local_20 + 0x34) = 1;
    local_20 = local_20 + 0x60;
  }
  lVar2 = jdiv_round_up((ulong)*(uint *)((long)in_RDI + 0x54),
                        (long)((int)in_RDI[0x2c] * *(int *)((long)in_RDI + 0x1dc)));
  *(int *)((long)in_RDI + 0x16c) = (int)lVar2;
  return;
}

Assistant:

LOCAL(void)
initial_setup (j_compress_ptr cinfo, boolean transcode_only)
/* Do computations that are needed before master selection phase */
{
  int ci, ssize;
  jpeg_component_info *compptr;
  long samplesperrow;
  JDIMENSION jd_samplesperrow;

  if (transcode_only)
    jpeg_calc_trans_dimensions(cinfo);
  else
    jpeg_calc_jpeg_dimensions(cinfo);

  /* Sanity check on block_size */
  if (cinfo->block_size < 1 || cinfo->block_size > 16)
    ERREXIT2(cinfo, JERR_BAD_DCTSIZE, cinfo->block_size, cinfo->block_size);

  /* Derive natural_order from block_size */
  switch (cinfo->block_size) {
  case 2: cinfo->natural_order = jpeg_natural_order2; break;
  case 3: cinfo->natural_order = jpeg_natural_order3; break;
  case 4: cinfo->natural_order = jpeg_natural_order4; break;
  case 5: cinfo->natural_order = jpeg_natural_order5; break;
  case 6: cinfo->natural_order = jpeg_natural_order6; break;
  case 7: cinfo->natural_order = jpeg_natural_order7; break;
  default: cinfo->natural_order = jpeg_natural_order; break;
  }

  /* Derive lim_Se from block_size */
  cinfo->lim_Se = cinfo->block_size < DCTSIZE ?
    cinfo->block_size * cinfo->block_size - 1 : DCTSIZE2-1;

  /* Sanity check on image dimensions */
  if (cinfo->jpeg_height <= 0 || cinfo->jpeg_width <= 0 ||
      cinfo->num_components <= 0 || cinfo->input_components <= 0)
    ERREXIT(cinfo, JERR_EMPTY_IMAGE);

  /* Make sure image isn't bigger than I can handle */
  if ((long) cinfo->jpeg_height > (long) JPEG_MAX_DIMENSION ||
      (long) cinfo->jpeg_width > (long) JPEG_MAX_DIMENSION)
    ERREXIT1(cinfo, JERR_IMAGE_TOO_BIG, (unsigned int) JPEG_MAX_DIMENSION);

  /* Width of an input scanline must be representable as JDIMENSION. */
  samplesperrow = (long) cinfo->image_width * (long) cinfo->input_components;
  jd_samplesperrow = (JDIMENSION) samplesperrow;
  if ((long) jd_samplesperrow != samplesperrow)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* For now, precision must match compiled-in value... */
  if (cinfo->data_precision != BITS_IN_JSAMPLE)
    ERREXIT1(cinfo, JERR_BAD_PRECISION, cinfo->data_precision);

  /* Check that number of components won't exceed internal array sizes */
  if (cinfo->num_components > MAX_COMPONENTS)
    ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	     MAX_COMPONENTS);

  /* Compute maximum sampling factors; check factor validity */
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    if (compptr->h_samp_factor<=0 || compptr->h_samp_factor>MAX_SAMP_FACTOR ||
	compptr->v_samp_factor<=0 || compptr->v_samp_factor>MAX_SAMP_FACTOR)
      ERREXIT(cinfo, JERR_BAD_SAMPLING);
    cinfo->max_h_samp_factor = MAX(cinfo->max_h_samp_factor,
				   compptr->h_samp_factor);
    cinfo->max_v_samp_factor = MAX(cinfo->max_v_samp_factor,
				   compptr->v_samp_factor);
  }

  /* Compute dimensions of components */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Fill in the correct component_index value; don't rely on application */
    compptr->component_index = ci;
    /* In selecting the actual DCT scaling for each component, we try to
     * scale down the chroma components via DCT scaling rather than downsampling.
     * This saves time if the downsampler gets to use 1:1 scaling.
     * Note this code adapts subsampling ratios which are powers of 2.
     */
    ssize = 1;
#ifdef DCT_SCALING_SUPPORTED
    while (cinfo->min_DCT_h_scaled_size * ssize <=
	   (cinfo->do_fancy_downsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_h_samp_factor % (compptr->h_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
#endif
    compptr->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * ssize;
    ssize = 1;
#ifdef DCT_SCALING_SUPPORTED
    while (cinfo->min_DCT_v_scaled_size * ssize <=
	   (cinfo->do_fancy_downsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_v_samp_factor % (compptr->v_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
#endif
    compptr->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * ssize;

    /* We don't support DCT ratios larger than 2. */
    if (compptr->DCT_h_scaled_size > compptr->DCT_v_scaled_size * 2)
	compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size * 2;
    else if (compptr->DCT_v_scaled_size > compptr->DCT_h_scaled_size * 2)
	compptr->DCT_v_scaled_size = compptr->DCT_h_scaled_size * 2;

    /* Size in DCT blocks */
    compptr->width_in_blocks = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_width * (long) compptr->h_samp_factor,
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->height_in_blocks = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_height * (long) compptr->v_samp_factor,
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
    /* Size in samples */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_width *
		    (long) (compptr->h_samp_factor * compptr->DCT_h_scaled_size),
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_height *
		    (long) (compptr->v_samp_factor * compptr->DCT_v_scaled_size),
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
    /* Mark component needed (this flag isn't actually used for compression) */
    compptr->component_needed = TRUE;
  }

  /* Compute number of fully interleaved MCU rows (number of times that
   * main controller will call coefficient controller).
   */
  cinfo->total_iMCU_rows = (JDIMENSION)
    jdiv_round_up((long) cinfo->jpeg_height,
		  (long) (cinfo->max_v_samp_factor * cinfo->block_size));
}